

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O3

void __thiscall
TEST_OutOfMemoryTestsForOperatorNew_FailingNewArrayOperatorThrowsAnExceptionWhenUsingStdCppNewWithoutOverride_Test
::testBody(TEST_OutOfMemoryTestsForOperatorNew_FailingNewArrayOperatorThrowsAnExceptionWhenUsingStdCppNewWithoutOverride_Test
           *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString failure_msg;
  SimpleString local_30 [2];
  
  SimpleString::SimpleString(local_30,"expected to throw CPPUTEST_BAD_ALLOC\nbut threw nothing");
  some_memory = (char *)operator_new__(10);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString(local_30);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x1a])
            (pUVar1,pcVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryOperatorOverloadTest.cpp"
             ,0x1c3,pTVar3);
  SimpleString::~SimpleString(local_30);
  return;
}

Assistant:

TEST(OutOfMemoryTestsForOperatorNew, FailingNewArrayOperatorThrowsAnExceptionWhenUsingStdCppNewWithoutOverride)
{
    CHECK_THROWS(CPPUTEST_BAD_ALLOC, some_memory = new char[10]);
}